

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line_to_quad<charls::transform_hp1<unsigned_short>::inverse,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,quad<unsigned_short> *destination,
               size_t pixel_stride,inverse *transform)

{
  ushort uVar1;
  size_t sVar2;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  if (pixel_stride != 0) {
    sVar2 = 0;
    do {
      uVar1 = source[pixel_stride_in + sVar2];
      destination[sVar2] =
           (quad<unsigned_short>)
           ((ulong)source[pixel_stride_in * 3 + sVar2] << 0x30 |
           (ulong)((ushort)(source[sVar2] + uVar1) ^ 0x8000) |
           (ulong)uVar1 << 0x10 |
           (ulong)((ushort)(source[pixel_stride_in * 2 + sVar2] + uVar1) ^ 0x8000) << 0x20);
      sVar2 = sVar2 + 1;
    } while (pixel_stride != sVar2);
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}